

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  Pgno PVar1;
  uint uVar2;
  int iVar3;
  u8 eType;
  MemPage *pFreePg;
  uint local_48;
  uint local_44;
  Pgno iFreePg_1;
  Pgno iPtrPage;
  Pgno iFreePg;
  
  PVar1 = ptrmapPageno(pBt,iLastPg);
  if ((PVar1 != iLastPg) && ((uint)sqlite3PendingByte / pBt->pageSize + 1 != iLastPg)) {
    if (*(int *)(pBt->pPage1->aData + 0x24) == 0) {
      return 0x65;
    }
    iVar3 = ptrmapGet(pBt,iLastPg,&eType,&iPtrPage);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (eType == '\x02') {
      if (bCommit == 0) {
        iVar3 = allocateBtreePage(pBt,&pFreePg,&iFreePg,iLastPg,'\x01');
        if (iVar3 != 0) {
          return iVar3;
        }
        releasePage(pFreePg);
      }
    }
    else {
      if (eType == '\x01') {
        iVar3 = sqlite3CorruptError(0xf3a4);
        return iVar3;
      }
      iVar3 = btreeGetPage(pBt,iLastPg,&pFreePg,0);
      if (iVar3 != 0) {
        return iVar3;
      }
      local_48 = (uint)eType;
      PVar1 = 0;
      if (bCommit == 0) {
        PVar1 = nFin;
      }
      local_44 = (uint)(byte)((bCommit == 0) * '\x02');
      do {
        iVar3 = allocateBtreePage(pBt,(MemPage **)&iFreePg,&iFreePg_1,PVar1,(u8)local_44);
        if (iVar3 != 0) {
          releasePage(pFreePg);
          return iVar3;
        }
        releasePage(_iFreePg);
      } while ((bCommit != 0) && (nFin < iFreePg_1));
      iVar3 = relocatePage(pBt,pFreePg,(u8)local_48,iPtrPage,iFreePg_1,bCommit);
      releasePage(pFreePg);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
  }
  if (bCommit == 0) {
    uVar2 = (uint)sqlite3PendingByte / pBt->pageSize;
    do {
      do {
        iLastPg = iLastPg - 1;
      } while ((-2 - uVar2) + iLastPg == -1);
      PVar1 = ptrmapPageno(pBt,iLastPg);
    } while (iLastPg == PVar1);
    pBt->bDoTruncate = '\x01';
    pBt->nPage = iLastPg;
  }
  return 0;
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't 
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );
      
      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}